

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  initializer_list<Jinx::Impl::SymbolType> symbols;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  VisibilityType scope_00;
  uint32_t count;
  pointer pSVar4;
  element_type *this_00;
  String *pSVar5;
  mapped_type *this_01;
  RuntimeID RVar6;
  size_t sVar7;
  size_t address;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  initializer_list<Jinx::Impl::SymbolType> local_188;
  undefined1 local_178 [8];
  String name_1;
  bool propExists;
  size_t addressPlaceholder;
  bool jumpTrue;
  size_t expressionAddress;
  uint32_t local_10c;
  SymbolType local_108;
  uint32_t subscripts_1;
  iterator local_100;
  undefined8 local_f8;
  undefined1 local_f0 [8];
  String name;
  undefined1 local_c0 [4];
  uint32_t subscripts;
  PropertyName propertyName;
  bool readOnly;
  VisibilityType scope;
  bool set;
  undefined1 local_40 [8];
  FunctionMatch functionMatch;
  bool returnedValue;
  Parser *this_local;
  
  if ((this->m_error & 1U) != 0) {
    this_local._7_1_ = 0;
    goto LAB_002e1a34;
  }
  functionMatch.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  CheckFunctionCall((FunctionMatch *)local_40,this);
  if (local_40 == (undefined1  [8])0x0) {
    bVar1 = Accept(this,Set);
    scope_00 = ParseScope(this);
    bVar2 = Accept(this,Readonly);
    if ((!bVar2) || (scope_00 != Local)) {
      bVar3 = Accept(this,Function);
      if (bVar3) {
        ParseFunctionDefinition(this,scope_00);
      }
      else if ((bVar1) && (bVar1 = CheckName(this), bVar1)) {
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&this->m_currentSymbol);
        this_00 = std::
                  __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_library);
        pSVar5 = Library::GetName_abi_cxx11_(this_00);
        bVar1 = std::operator==(&pSVar4->text,pSVar5);
        if (bVar1) {
          Error<>(this,"Illegal use of library name in identifier");
          this_local._7_1_ = 0;
          propertyName.m_partCount._4_4_ = 1;
          goto LAB_002e1a1e;
        }
        if (scope_00 == Local) {
          bVar1 = CheckProperty(this,(size_t *)0x0);
          if (bVar1) {
            ParsePropertyName((PropertyName *)local_c0,this);
            bVar1 = PropertyName::IsReadOnly((PropertyName *)local_c0);
            if (bVar1) {
              Error<>(this,"Can\'t change readonly property");
              this_local._7_1_ = 0;
              propertyName.m_partCount._4_4_ = 1;
            }
            else {
              count = ParseSubscriptSet(this);
              Expect(this,To,(char *)0x0);
              ParseExpression(this);
              Expect(this,NewLine,(char *)0x0);
              if (count == 0) {
                EmitOpcode(this,SetProp);
              }
              else {
                EmitOpcode(this,SetPropKeyVal);
                EmitCount(this,count);
              }
              RVar6 = PropertyName::GetId((PropertyName *)local_c0);
              EmitId(this,RVar6);
              pSVar5 = PropertyName::GetName_abi_cxx11_((PropertyName *)local_c0);
              name.field_2._8_8_ = PropertyName::GetId((PropertyName *)local_c0);
              this_01 = std::
                        map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                        ::operator[](&this->m_idNameMap,
                                     (key_type_conflict *)(name.field_2._M_local_buf + 8));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator=(this_01,pSVar5);
              propertyName.m_partCount._4_4_ = 0;
            }
            PropertyName::~PropertyName((PropertyName *)local_c0);
            if (propertyName.m_partCount._4_4_ != 0) goto LAB_002e1a1e;
          }
          else {
            local_108 = To;
            subscripts_1 = 0x14;
            local_100 = &local_108;
            local_f8 = 2;
            symbols._M_len = 2;
            symbols._M_array = local_100;
            ParseMultiName_abi_cxx11_((String *)local_f0,this,symbols);
            local_10c = ParseSubscriptSet(this);
            Expect(this,To,(char *)0x0);
            ParseExpression(this);
            Expect(this,NewLine,"Unable to parse expression");
            VariableAssign(this,(String *)local_f0);
            if (local_10c == 0) {
              EmitOpcode(this,SetVar);
            }
            else {
              EmitOpcode(this,SetVarKeyVal);
              EmitCount(this,local_10c);
            }
            RVar6 = VariableNameToRuntimeID(this,(String *)local_f0);
            EmitId(this,RVar6);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                          local_f0);
          }
        }
        else {
          ParsePropertyDeclaration(this,scope_00,bVar2);
        }
      }
      else if (scope_00 == Local) {
        bVar1 = Accept(this,Begin);
        if (bVar1) {
          Expect(this,NewLine,(char *)0x0);
          ParseBlock(this);
          Expect(this,End,(char *)0x0);
          Expect(this,NewLine,(char *)0x0);
        }
        else {
          bVar1 = Accept(this,If);
          if (bVar1) {
            ParseIfElse(this);
          }
          else {
            bVar1 = Accept(this,Loop);
            if (bVar1) {
              ParseLoop(this);
            }
            else {
              bVar1 = Accept(this,Erase);
              if (bVar1) {
                ParseErase(this);
              }
              else {
                bVar1 = Check(this,Increment);
                if ((bVar1) || (bVar1 = Check(this,Decrement), bVar1)) {
                  ParseIncDec(this);
                }
                else {
                  bVar1 = Accept(this,Return);
                  if (bVar1) {
                    bVar1 = VariableStackFrame::IsRootFrame(&this->m_variableStackFrame);
                    if (bVar1) {
                      bVar1 = Check(this,NewLine);
                      if (!bVar1) {
                        LogWriteLine(Warning,"Return values at root scope do nothing");
                        ParseExpression(this);
                      }
                      EmitOpcode(this,Exit);
                      Accept(this,NewLine);
                    }
                    else {
                      bVar1 = Check(this,NewLine);
                      if (bVar1) {
                        EmitOpcode(this,PushVal);
                        Jinx::Variant::Variant((Variant *)&expressionAddress,(nullptr_t)0x0);
                        EmitValue(this,(Variant *)&expressionAddress);
                        Jinx::Variant::~Variant((Variant *)&expressionAddress);
                      }
                      else {
                        ParseExpression(this);
                      }
                      EmitOpcode(this,Return);
                      Accept(this,NewLine);
                    }
                    functionMatch.partData.
                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                  }
                  else {
                    bVar1 = Accept(this,Break);
                    if (bVar1) {
                      Expect(this,NewLine,(char *)0x0);
                      EmitOpcode(this,Jump);
                      sVar7 = EmitAddressPlaceholder(this);
                      this->m_breakAddress = sVar7;
                    }
                    else {
                      bVar1 = Accept(this,Wait);
                      if (bVar1) {
                        bVar1 = Accept(this,NewLine);
                        if (bVar1) {
                          EmitOpcode(this,Wait);
                        }
                        else {
                          bVar1 = Check(this,Until);
                          if ((bVar1) || (bVar1 = Check(this,While), bVar1)) {
                            sVar7 = BinaryWriter::Tell(&this->m_writer);
                            bVar1 = Accept(this,Until);
                            if (!bVar1) {
                              Expect(this,While,(char *)0x0);
                            }
                            ParseExpression(this);
                            bVar2 = Expect(this,NewLine,(char *)0x0);
                            if (!bVar2) {
                              this_local._7_1_ = 0;
                              propertyName.m_partCount._4_4_ = 1;
                              goto LAB_002e1a1e;
                            }
                            EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
                            address = EmitAddressPlaceholder(this);
                            EmitOpcode(this,Wait);
                            EmitOpcode(this,Jump);
                            EmitAddress(this,sVar7);
                            EmitAddressBackfill(this,address);
                          }
                          else {
                            Error<>(this,"Unexpected symbol after wait");
                          }
                        }
                      }
                      else {
                        bVar1 = Accept(this,External);
                        if (bVar1) {
                          name_1.field_2._M_local_buf[0xf] = CheckProperty(this,(size_t *)0x0);
                          std::initializer_list<Jinx::Impl::SymbolType>::initializer_list
                                    (&local_188);
                          ParseMultiName_abi_cxx11_((String *)local_178,this,local_188);
                          bVar1 = VariableStackFrame::IsRootFrame(&this->m_variableStackFrame);
                          if (bVar1) {
                            bVar1 = VariableStackFrame::IsRootScope(&this->m_variableStackFrame);
                            if (bVar1) {
                              if ((name_1.field_2._M_local_buf[0xf] & 1U) == 0) {
                                bVar1 = VariableStackFrame::VariableExists
                                                  (&this->m_variableStackFrame,(String *)local_178);
                                if (bVar1) {
                                  local_1a8 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                              ::c_str((
                                                  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                  *)local_178);
                                  Error<char_const*>(this,"Variable \'%s\' already exists",
                                                     &local_1a8);
                                }
                                else {
                                  bVar1 = VariableStackFrame::VariableAssign
                                                    (&this->m_variableStackFrame,(String *)local_178
                                                    );
                                  if (!bVar1) {
                                    local_1b0 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                ::c_str((
                                                  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                  *)local_178);
                                    Error<char_const*>(this,
                                                  "Error creating external variable \'%s\'",
                                                  &local_1b0);
                                  }
                                }
                              }
                              else {
                                local_1a0 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                            ::c_str((
                                                  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                  *)local_178);
                                Error<char_const*>(this,
                                                  "External variable \'%s\' is already a property name"
                                                  ,&local_1a0);
                              }
                            }
                            else {
                              local_198 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                          ::c_str((
                                                  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                  *)local_178);
                              Error<char_const*>(this,
                                                 "External variable \'%s\' must be declared at the root scope"
                                                 ,&local_198);
                            }
                          }
                          else {
                            local_190 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                        ::c_str((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                                 *)local_178);
                            Error<char_const*>(this,
                                               "External variable \'%s\' can\'t be declared in a function"
                                               ,&local_190);
                          }
                          Expect(this,NewLine,(char *)0x0);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                          ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                         *)local_178);
                        }
                        else {
                          Error<>(this,"Unknown symbol in statement");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        local_1b8 = "private";
        if (scope_00 == Public) {
          local_1b8 = "public";
        }
        Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",&local_1b8);
      }
      goto LAB_002e1a0f;
    }
    Error<>(this,"The \'readonly\' keyword must follow a private or public keyword");
    this_local._7_1_ = 0;
    propertyName.m_partCount._4_4_ = 1;
  }
  else {
    ParseFunctionCall(this,(FunctionMatch *)local_40);
    EmitOpcode(this,Pop);
    Expect(this,NewLine,(char *)0x0);
LAB_002e1a0f:
    this_local._7_1_ =
         functionMatch.partData.
         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
    propertyName.m_partCount._4_4_ = 1;
  }
LAB_002e1a1e:
  FunctionMatch::~FunctionMatch((FunctionMatch *)local_40);
LAB_002e1a34:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline_t bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}